

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch.cc
# Opt level: O3

void __thiscall leveldb::WriteBatch::~WriteBatch(WriteBatch *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long in_FS_OFFSET;
  
  pcVar1 = (this->rep_)._M_dataplus._M_p;
  paVar2 = &(this->rep_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  __stack_chk_fail();
}

Assistant:

WriteBatch::~WriteBatch() = default;